

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O1

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint3 uVar1;
  byte bVar2;
  long lVar3;
  uint32_t *puVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  byte bVar13;
  uint uVar14;
  uint8_t pow [256];
  byte abStack_238 [256];
  byte abStack_138 [264];
  
  if (keybits == 0x80) {
    iVar7 = 10;
  }
  else if (keybits == 0x100) {
    iVar7 = 0xe;
  }
  else {
    if (keybits != 0xc0) {
      return -0x20;
    }
    iVar7 = 0xc;
  }
  ctx->nr = iVar7;
  if (aes_init_done == '\0') {
    uVar10 = 1;
    lVar3 = 0;
    do {
      bVar2 = (byte)uVar10;
      abStack_138[lVar3] = bVar2;
      abStack_238[uVar10] = (byte)lVar3;
      uVar10 = (ulong)(byte)((char)bVar2 >> 7 & 0x1bU ^ bVar2 * '\x02' ^ bVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    uVar6 = 1;
    lVar3 = 0;
    do {
      *(uint *)((long)round_constants + lVar3) = uVar6 & 0xff;
      uVar6 = (uint)(int)(char)uVar6 >> 7 & 0x1b ^ (uVar6 & 0xff) * 2;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x28);
    FSb[0] = 'c';
    RSb[99] = '\0';
    lVar3 = 1;
    do {
      bVar2 = abStack_138[(ulong)abStack_238[lVar3] ^ 0xff];
      uVar10 = (ulong)(byte)((bVar2 << 2 | bVar2 >> 6) ^ bVar2 ^
                             (bVar2 << 4 | bVar2 >> 4) ^ (bVar2 << 1 | (char)bVar2 < '\0') ^
                            (bVar2 << 3 | bVar2 >> 5)) ^ 99;
      FSb[lVar3] = (uchar)uVar10;
      RSb[uVar10] = (uchar)lVar3;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x100);
    lVar3 = -0x400;
    lVar12 = 0;
    do {
      bVar2 = FSb[lVar12];
      bVar13 = (char)bVar2 >> 7 & 0x1bU ^ bVar2 * '\x02';
      bVar5 = bVar13 ^ bVar2;
      uVar1 = CONCAT12(bVar2,CONCAT11(bVar2,bVar13));
      *(uint *)((long)FT1 + lVar3) = CONCAT13(bVar5,uVar1);
      iVar7 = CONCAT31(uVar1,bVar5);
      *(int *)((long)FT2 + lVar3) = iVar7;
      *(uint *)((long)FT3 + lVar3) = iVar7 << 8 | (uint)bVar2;
      *(uint *)(RSb + lVar3) = iVar7 << 0x10 | (uint)(uVar1 >> 8);
      uVar10 = (ulong)RSb[lVar12];
      uVar6 = 0;
      if (uVar10 != 0) {
        uVar6 = (uint)abStack_138[((uint)abStack_238[uVar10] + (uint)abStack_238[0xe]) % 0xff];
      }
      uVar8 = 0;
      uVar11 = 0;
      if (uVar10 == 0) {
        uVar14 = 0;
      }
      else {
        uVar11 = (uint)abStack_138[((uint)abStack_238[uVar10] + (uint)abStack_238[9]) % 0xff] << 8;
        uVar8 = (uint)abStack_138[((uint)abStack_238[uVar10] + (uint)abStack_238[0xd]) % 0xff] <<
                0x10;
        uVar14 = (uint)abStack_138[((uint)abStack_238[uVar10] + (uint)abStack_238[0xb]) % 0xff] <<
                 0x18;
      }
      uVar8 = uVar8 ^ (uVar11 | uVar6);
      uVar9 = uVar8 ^ uVar14;
      *(uint *)((long)RT1 + lVar3) = uVar9;
      *(uint *)((long)RT2 + lVar3) = uVar8 << 8 | uVar14 >> 0x18;
      *(uint *)((long)RT3 + lVar3) = (uVar11 | uVar6) << 0x10 | uVar9 >> 0x10;
      *(uint *)((long)FT0 + lVar3) = uVar6 << 0x18 | uVar9 >> 8;
      lVar12 = lVar12 + 1;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0);
    aes_init_done = '\x01';
  }
  puVar4 = ctx->buf;
  ctx->rk_offset = 0;
  if (0x1f < keybits) {
    uVar10 = 0;
    do {
      puVar4[uVar10] = *(uint32_t *)(key + uVar10 * 4);
      uVar10 = uVar10 + 1;
    } while (keybits >> 5 != uVar10);
  }
  iVar7 = ctx->nr;
  if (iVar7 == 10) {
    lVar3 = 0;
    do {
      uVar6 = ctx->buf[lVar3 + 3];
      uVar11 = (uint)FSb[uVar6 & 0xff] << 0x18 ^ (uint)FSb[uVar6 >> 0x18] << 0x10 ^
               (uint)FSb[uVar6 >> 0x10 & 0xff] << 8 ^
               (uint)FSb[uVar6 >> 8 & 0xff] ^
               *(uint *)((long)round_constants + lVar3) ^ puVar4[lVar3];
      ctx->buf[lVar3 + 4] = uVar11;
      uVar11 = uVar11 ^ ctx->buf[lVar3 + 1];
      ctx->buf[lVar3 + 5] = uVar11;
      uVar11 = uVar11 ^ ctx->buf[lVar3 + 2];
      ctx->buf[lVar3 + 6] = uVar11;
      ctx->buf[lVar3 + 7] = uVar11 ^ uVar6;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x28);
  }
  else if (iVar7 == 0xc) {
    lVar3 = 0;
    do {
      uVar6 = puVar4[5];
      uVar11 = (uint)FSb[uVar6 & 0xff] << 0x18 ^ (uint)FSb[uVar6 >> 0x18] << 0x10 ^
               (uint)FSb[uVar6 >> 0x10 & 0xff] << 8 ^
               (uint)FSb[uVar6 >> 8 & 0xff] ^ *(uint *)((long)round_constants + lVar3) ^ *puVar4;
      puVar4[6] = uVar11;
      uVar11 = uVar11 ^ puVar4[1];
      puVar4[7] = uVar11;
      uVar11 = uVar11 ^ puVar4[2];
      puVar4[8] = uVar11;
      uVar11 = uVar11 ^ puVar4[3];
      puVar4[9] = uVar11;
      uVar11 = uVar11 ^ puVar4[4];
      puVar4[10] = uVar11;
      puVar4[0xb] = uVar11 ^ uVar6;
      puVar4 = puVar4 + 6;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
  }
  else if (iVar7 == 0xe) {
    lVar3 = 0;
    do {
      uVar6 = ctx->buf[lVar3 * 2 + 7];
      uVar11 = (uint)FSb[uVar6 & 0xff] << 0x18 ^ (uint)FSb[uVar6 >> 0x18] << 0x10 ^
               (uint)FSb[uVar6 >> 0x10 & 0xff] << 8 ^
               (uint)FSb[uVar6 >> 8 & 0xff] ^
               *(uint *)((long)round_constants + lVar3) ^ puVar4[lVar3 * 2];
      ctx->buf[lVar3 * 2 + 8] = uVar11;
      uVar11 = uVar11 ^ ctx->buf[lVar3 * 2 + 1];
      ctx->buf[lVar3 * 2 + 9] = uVar11;
      uVar11 = uVar11 ^ ctx->buf[lVar3 * 2 + 2];
      ctx->buf[lVar3 * 2 + 10] = uVar11;
      uVar11 = uVar11 ^ ctx->buf[lVar3 * 2 + 3];
      ctx->buf[lVar3 * 2 + 0xb] = uVar11;
      uVar11 = (uint)FSb[uVar11 >> 0x18] << 0x18 ^ (uint)FSb[uVar11 >> 0x10 & 0xff] << 0x10 ^
               (uint)FSb[uVar11 >> 8 & 0xff] << 8 ^
               (uint)FSb[uVar11 & 0xff] ^ ctx->buf[lVar3 * 2 + 4];
      ctx->buf[lVar3 * 2 + 0xc] = uVar11;
      uVar11 = uVar11 ^ ctx->buf[lVar3 * 2 + 5];
      ctx->buf[lVar3 * 2 + 0xd] = uVar11;
      uVar11 = uVar11 ^ ctx->buf[lVar3 * 2 + 6];
      ctx->buf[lVar3 * 2 + 0xe] = uVar11;
      ctx->buf[lVar3 * 2 + 0xf] = uVar11 ^ uVar6;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x1c);
  }
  return 0;
}

Assistant:

int mbedtls_aes_setkey_enc(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
    uint32_t *RK;

    switch (keybits) {
        case 128: ctx->nr = 10; break;
#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 192: ctx->nr = 12; break;
        case 256: ctx->nr = 14; break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
        default: return MBEDTLS_ERR_AES_INVALID_KEY_LENGTH;
    }

#if !defined(MBEDTLS_AES_ROM_TABLES)
    if (aes_init_done == 0) {
        aes_gen_tables();
        aes_init_done = 1;
    }
#endif

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        return mbedtls_aesni_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        return mbedtls_aesce_setkey_enc((unsigned char *) RK, key, keybits);
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    for (unsigned int i = 0; i < (keybits >> 5); i++) {
        RK[i] = MBEDTLS_GET_UINT32_LE(key, i << 2);
    }

    switch (ctx->nr) {
        case 10:

            for (unsigned int i = 0; i < 10; i++, RK += 4) {
                RK[4]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[3])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[3])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[3])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[3])] << 24);

                RK[5]  = RK[1] ^ RK[4];
                RK[6]  = RK[2] ^ RK[5];
                RK[7]  = RK[3] ^ RK[6];
            }
            break;

#if !defined(MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH)
        case 12:

            for (unsigned int i = 0; i < 8; i++, RK += 6) {
                RK[6]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[5])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[5])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[5])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[5])] << 24);

                RK[7]  = RK[1] ^ RK[6];
                RK[8]  = RK[2] ^ RK[7];
                RK[9]  = RK[3] ^ RK[8];
                RK[10] = RK[4] ^ RK[9];
                RK[11] = RK[5] ^ RK[10];
            }
            break;

        case 14:

            for (unsigned int i = 0; i < 7; i++, RK += 8) {
                RK[8]  = RK[0] ^ round_constants[i] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[7])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[7])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[7])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[7])] << 24);

                RK[9]  = RK[1] ^ RK[8];
                RK[10] = RK[2] ^ RK[9];
                RK[11] = RK[3] ^ RK[10];

                RK[12] = RK[4] ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_0(RK[11])]) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_1(RK[11])] <<  8) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_2(RK[11])] << 16) ^
                         ((uint32_t) FSb[MBEDTLS_BYTE_3(RK[11])] << 24);

                RK[13] = RK[5] ^ RK[12];
                RK[14] = RK[6] ^ RK[13];
                RK[15] = RK[7] ^ RK[14];
            }
            break;
#endif /* !MBEDTLS_AES_ONLY_128_BIT_KEY_LENGTH */
    }

    return 0;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
}